

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O1

void __thiscall GlobOpt::RecordInlineeFrameInfo(GlobOpt *this,Instr *inlineeEnd)

{
  OpCode OVar1;
  uint uVar2;
  InlineeFrameInfo *pIVar3;
  Opnd *pOVar4;
  _func_int **pp_Var5;
  List<InlineFrameInfoValue,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  Type pIVar6;
  code *pcVar7;
  bool bVar8;
  OpndKind OVar9;
  BOOLEAN BVar10;
  ArgSlot AVar11;
  uint uVar12;
  uint functionId;
  Func *curFunc;
  undefined4 *puVar13;
  StackSym *pSVar14;
  JITTimeFunctionBody *this_01;
  FunctionJITTimeInfo *this_02;
  Value *pVVar15;
  GlobOptBlockData *this_03;
  Value *pVVar16;
  Func *pFVar17;
  InlineeFrameInfoValueType IVar18;
  uint uVar19;
  Instr *pIVar20;
  Instr *pIVar21;
  BailoutConstantValue BVar22;
  anon_union_8_3_5e50e90d_for_u local_58;
  StackSym *local_40;
  
  if (this->prePassLoop == (Loop *)0x0) {
    pIVar3 = inlineeEnd->m_func->frameInfo;
    if (pIVar3->isRecorded != true) {
      pSVar14 = IR::Opnd::GetStackSym(inlineeEnd->m_src2);
      if (((pSVar14->field_0x18 & 1) == 0) || ((pSVar14->field_5).m_instrDef == (Instr *)0x0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
        if (!bVar8) goto LAB_00491aed;
        *puVar13 = 0;
      }
      pIVar20 = (pSVar14->field_5).m_instrDef;
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        if ((pIVar20->m_src2 == (Opnd *)0x0) ||
           (OVar9 = IR::Opnd::GetKind(pIVar20->m_src2), OVar9 != OpndKindSym)) {
LAB_004914d7:
          pIVar21 = (Instr *)0x0;
        }
        else {
          pOVar4 = pIVar20->m_src2;
          OVar9 = IR::Opnd::GetKind(pOVar4);
          if (OVar9 != OpndKindSym) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
            if (!bVar8) goto LAB_00491aed;
            *puVar13 = 0;
          }
          pp_Var5 = pOVar4[1]._vptr_Opnd;
          if (*(char *)((long)pp_Var5 + 0x14) != '\x01') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                               ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
            if (!bVar8) goto LAB_00491aed;
            *puVar13 = 0;
          }
          if (((*(byte *)((long)pp_Var5 + 0x1a) & 0x10) != 0) &&
             (*(short *)((long)pp_Var5 + 0x16) == 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                               ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
            if (!bVar8) goto LAB_00491aed;
            *puVar13 = 0;
          }
          if ((*(byte *)((long)pp_Var5 + 0x1a) & 0x10) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
            if (!bVar8) goto LAB_00491aed;
            *puVar13 = 0;
          }
          if ((((((ulong)pp_Var5[3] & 1) == 0) || (pp_Var5[5] == (_func_int *)0x0)) &&
              (bVar8 = Func::IsInPhase(inlineeEnd->m_func,FGPeepsPhase), !bVar8)) &&
             (bVar8 = Func::IsInPhase(inlineeEnd->m_func,FGBuildPhase), !bVar8)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                               ,0x1bf,
                               "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                               ,
                               "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                              );
            if (!bVar8) goto LAB_00491aed;
            *puVar13 = 0;
          }
          if (((ulong)pp_Var5[3] & 1) == 0) goto LAB_004914d7;
          pIVar21 = (Instr *)pp_Var5[5];
        }
        OVar1 = pIVar20->m_opcode;
        if (OVar1 != ArgOut_A_InlineSpecialized) {
          if (OVar1 == InlineeStart) {
            if ((pIVar3->function).type != InlineeFrameInfoValueType_None) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar13 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                 ,0x32a,
                                 "(frameInfo->function.type == InlineeFrameInfoValueType_None)",
                                 "frameInfo->function.type == InlineeFrameInfoValueType_None");
              if (!bVar8) goto LAB_00491aed;
              *puVar13 = 0;
            }
            pOVar4 = pIVar20->m_src1;
            OVar9 = IR::Opnd::GetKind(pOVar4);
            if (OVar9 != OpndKindReg) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar13 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
              if (!bVar8) goto LAB_00491aed;
              *puVar13 = 0;
            }
            bVar8 = StackSym::IsConst((StackSym *)pOVar4[1]._vptr_Opnd);
            if (bVar8) {
              BVar22 = StackSym::GetConstValueForBailout((StackSym *)pOVar4[1]._vptr_Opnd);
              (pIVar3->function).type = InlineeFrameInfoValueType_Const;
              (pIVar3->function).field_1.constValue.type = BVar22.type;
              (pIVar3->function).field_1.constValue.u = BVar22.u;
            }
            else {
              if (pIVar3->functionSymStartValue == (Value *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar13 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                   ,0x334,"(frameInfo->functionSymStartValue != nullptr)",
                                   "frameInfo->functionSymStartValue != nullptr");
                if (!bVar8) goto LAB_00491aed;
                *puVar13 = 0;
              }
              pVVar15 = pIVar3->functionSymStartValue;
              this_03 = CurrentBlockData(this);
              pVVar16 = GlobOptBlockData::FindValue(this_03,(Sym *)pOVar4[1]._vptr_Opnd);
              if (pVVar15->valueNumber != pVVar16->valueNumber) {
                pFVar17 = pIVar20->m_func;
                do {
                  *(uint *)&pFVar17->field_0x240 = *(uint *)&pFVar17->field_0x240 & 0xfffff7fd;
                  pFVar17->frameInfo = (InlineeFrameInfo *)0x0;
                  pFVar17 = pFVar17->parentFunc;
                } while (pFVar17 != (Func *)0x0);
LAB_00491a22:
                Memory::
                DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                          (this->alloc,pIVar3->intSyms);
                pIVar3->intSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
                Memory::
                DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                          (this->alloc,pIVar3->floatSyms);
                pIVar3->floatSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
                Memory::
                DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                          (this->alloc,pIVar3->varSyms);
                pIVar3->varSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
                pIVar3->isRecorded = true;
                return;
              }
              pSVar14 = (StackSym *)pOVar4[1]._vptr_Opnd;
              (pIVar3->function).type = InlineeFrameInfoValueType_Sym;
              (pIVar3->function).field_1.sym = pSVar14;
            }
          }
          else {
            if (OVar1 == StartCall) {
              if (pIVar21 != (Instr *)0x0) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar13 = 1;
                bVar8 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                                   ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
                if (!bVar8) goto LAB_00491aed;
                *puVar13 = 0;
              }
              goto LAB_00491a22;
            }
            if ((this->field_0xf7 & 2) != 0) goto LAB_00491a19;
            pOVar4 = pIVar20->m_dst;
            OVar9 = IR::Opnd::GetKind(pOVar4);
            if (OVar9 != OpndKindSym) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar13 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
              if (!bVar8) goto LAB_00491aed;
              *puVar13 = 0;
            }
            pSVar14 = (StackSym *)pOVar4[1]._vptr_Opnd;
            if ((pSVar14->super_Sym).m_kind != SymKindStack) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar13 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                                 ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
              if (!bVar8) goto LAB_00491aed;
              *puVar13 = 0;
            }
            AVar11 = StackSym::GetArgSlotNum(pSVar14);
            pOVar4 = pIVar20->m_src1;
            local_40 = IR::Opnd::GetStackSym(pOVar4);
            if (local_40 == (StackSym *)0x0) {
              BVar22 = IR::Opnd::GetConstValue(pOVar4);
LAB_0049196b:
              local_58 = BVar22.u;
              local_40 = (StackSym *)(ulong)BVar22.type;
              IVar18 = InlineeFrameInfoValueType_Const;
            }
            else {
              bVar8 = StackSym::IsConst(local_40);
              if ((bVar8) && (bVar8 = StackSym::IsInt64Const(local_40), !bVar8)) {
LAB_00491966:
                BVar22 = StackSym::GetConstValueForBailout(local_40);
                goto LAB_0049196b;
              }
              this_01 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
              uVar12 = JITTimeFunctionBody::GetSourceContextId(this_01);
              this_02 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
              functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
              bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,CopyPropPhase,uVar12,functionId)
              ;
              if ((((!bVar8) &&
                   ((pVVar15 = GlobOptBlockData::FindValue
                                         (&this->currentBlock->globOptData,&local_40->super_Sym),
                    pVVar15 != (Value *)0x0 &&
                    (pSVar14 = GlobOptBlockData::GetCopyPropSym
                                         (&this->currentBlock->globOptData,&local_40->super_Sym,
                                          pVVar15), pSVar14 != (StackSym *)0x0)))) &&
                  (pIVar3->varSyms->head != (Type_conflict)0x0)) &&
                 (BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                                     (pIVar3->varSyms,(pSVar14->super_Sym).m_id), BVar10 != '\0')) {
                local_40 = pSVar14;
              }
              if ((pIVar3->intSyms->head == (Type_conflict)0x0) ||
                 (BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                                     (pIVar3->intSyms,(local_40->super_Sym).m_id), BVar10 == '\0'))
              {
                if ((pIVar3->floatSyms->head == (Type_conflict)0x0) ||
                   (BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                                       (pIVar3->floatSyms,(local_40->super_Sym).m_id),
                   BVar10 == '\0')) {
                  BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                                     (pIVar3->varSyms,(local_40->super_Sym).m_id);
                  if (BVar10 == '\0') {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar13 = 1;
                    bVar8 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                       ,0x36b,"(frameInfo->varSyms->Test(argSym->m_id))",
                                       "frameInfo->varSyms->Test(argSym->m_id)");
                    if (bVar8) goto LAB_00491936;
                    goto LAB_00491aed;
                  }
                }
                else {
                  local_40 = StackSym::GetFloat64EquivSym(local_40,(Func *)0x0);
                  if (local_40 == (StackSym *)0x0) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar13 = 1;
                    uVar12 = 0x367;
                    goto LAB_00491914;
                  }
                }
              }
              else {
                local_40 = StackSym::GetInt32EquivSym(local_40,(Func *)0x0);
                if (local_40 == (StackSym *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar13 = 1;
                  uVar12 = 0x361;
LAB_00491914:
                  bVar8 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                     ,uVar12,"(argSym)","argSym");
                  if (!bVar8) goto LAB_00491aed;
                  local_40 = (StackSym *)0x0;
LAB_00491936:
                  *puVar13 = 0;
                }
              }
              bVar8 = StackSym::IsConst(local_40);
              IVar18 = InlineeFrameInfoValueType_Sym;
              if ((bVar8) && (bVar8 = StackSym::IsInt64Const(local_40), !bVar8)) goto LAB_00491966;
            }
            if (AVar11 == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar13 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                                 ,0x377,"(argSlot >= 1)","argSlot >= 1");
              if (!bVar8) goto LAB_00491aed;
              *puVar13 = 0;
            }
            this_00 = pIVar3->arguments;
            JsUtil::
            List<InlineFrameInfoValue,_Memory::JitArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::EnsureArray(this_00,(uint)AVar11);
            pIVar6 = (this_00->
                     super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                     ).buffer;
            pIVar6[(ulong)AVar11 - 1].type = IVar18;
            *(StackSym **)&pIVar6[(ulong)AVar11 - 1].field_1 = local_40;
            pIVar6[(ulong)AVar11 - 1].field_1.constValue.u = local_58;
            uVar2 = (this_00->
                    super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>
                    ).count;
            uVar19 = (uint)AVar11;
            if ((int)(uint)AVar11 < (int)uVar2) {
              uVar19 = uVar2;
            }
            (this_00->
            super_ReadOnlyList<InlineFrameInfoValue,_Memory::JitArenaAllocator,_DefaultComparer>).
            count = uVar19;
          }
        }
LAB_00491a19:
        pIVar20 = pIVar21;
        if (pIVar21 == (Instr *)0x0) goto LAB_00491a22;
      } while( true );
    }
    if ((pIVar3->function).type == InlineeFrameInfoValueType_None) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                         ,0x322,"(frameInfo->function.type != InlineeFrameInfoValueType_None)",
                         "frameInfo->function.type != InlineeFrameInfoValueType_None");
      if (!bVar8) {
LAB_00491aed:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar13 = 0;
    }
  }
  return;
}

Assistant:

void GlobOpt::RecordInlineeFrameInfo(IR::Instr* inlineeEnd)
{
    if (this->IsLoopPrePass())
    {
        return;
    }
    InlineeFrameInfo* frameInfo = inlineeEnd->m_func->frameInfo;
    if (frameInfo->isRecorded)
    {
        Assert(frameInfo->function.type != InlineeFrameInfoValueType_None);
        // Due to Cmp peeps in flow graph - InlineeEnd can be cloned.
        return;
    }
    inlineeEnd->IterateArgInstrs([=] (IR::Instr* argInstr)
    {
        if (argInstr->m_opcode == Js::OpCode::InlineeStart)
        {
            Assert(frameInfo->function.type == InlineeFrameInfoValueType_None);
            IR::RegOpnd* functionObject = argInstr->GetSrc1()->AsRegOpnd();
            if (functionObject->m_sym->IsConst())
            {
                frameInfo->function = InlineFrameInfoValue(functionObject->m_sym->GetConstValueForBailout());
            }
            else
            {
                // If the value of the functionObject symbol has changed between the inlineeStart and the inlineeEnd,
                // we don't record the inlinee frame info (see OS#18318884).
                Assert(frameInfo->functionSymStartValue != nullptr);
                if (!frameInfo->functionSymStartValue->IsEqualTo(CurrentBlockData()->FindValue(functionObject->m_sym)))
                {
                    argInstr->m_func->DisableCanDoInlineArgOpt();
                    return true;
                }

                frameInfo->function = InlineFrameInfoValue(functionObject->m_sym);
            }
        }
        else if(!GetIsAsmJSFunc()) // don't care about saving arg syms for wasm/asm.js
        {
            Js::ArgSlot argSlot = argInstr->GetDst()->AsSymOpnd()->m_sym->AsStackSym()->GetArgSlotNum();
            IR::Opnd* argOpnd = argInstr->GetSrc1();
            InlineFrameInfoValue frameInfoValue;
            StackSym* argSym = argOpnd->GetStackSym();
            if (!argSym)
            {
                frameInfoValue = InlineFrameInfoValue(argOpnd->GetConstValue());
            }
            else if (argSym->IsConst() && !argSym->IsInt64Const())
            {
                // InlineFrameInfo doesn't currently support Int64Const
                frameInfoValue = InlineFrameInfoValue(argSym->GetConstValueForBailout());
            }
            else
            {
                if (!PHASE_OFF(Js::CopyPropPhase, func))
                {
                    Value* value = this->currentBlock->globOptData.FindValue(argSym);
                    if (value)
                    {
                        StackSym * copyPropSym = this->currentBlock->globOptData.GetCopyPropSym(argSym, value);
                        if (copyPropSym &&
                            frameInfo->varSyms->TestEmpty() && frameInfo->varSyms->Test(copyPropSym->m_id))
                        {
                            argSym = copyPropSym;
                        }
                    }
                }

                if (frameInfo->intSyms->TestEmpty() && frameInfo->intSyms->Test(argSym->m_id))
                {
                    // Var version of the sym is not live, use the int32 version
                    argSym = argSym->GetInt32EquivSym(nullptr);
                    Assert(argSym);
                }
                else if (frameInfo->floatSyms->TestEmpty() && frameInfo->floatSyms->Test(argSym->m_id))
                {
                    // Var/int32 version of the sym is not live, use the float64 version
                    argSym = argSym->GetFloat64EquivSym(nullptr);
                    Assert(argSym);
                }
                else
                {
                    Assert(frameInfo->varSyms->Test(argSym->m_id));
                }

                if (argSym->IsConst() && !argSym->IsInt64Const())
                {
                    frameInfoValue = InlineFrameInfoValue(argSym->GetConstValueForBailout());
                }
                else
                {
                    frameInfoValue = InlineFrameInfoValue(argSym);
                }
            }
            Assert(argSlot >= 1);
            frameInfo->arguments->SetItem(argSlot - 1, frameInfoValue);
        }
        return false;
    });

    JitAdelete(this->alloc, frameInfo->intSyms);
    frameInfo->intSyms = nullptr;
    JitAdelete(this->alloc, frameInfo->floatSyms);
    frameInfo->floatSyms = nullptr;
    JitAdelete(this->alloc, frameInfo->varSyms);
    frameInfo->varSyms = nullptr;
    frameInfo->isRecorded = true;
}